

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void testTinySVD(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing TinySVD algorithms in single precision..."
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  testTinySVDImp<float>();
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing TinySVD algorithms in double precision..."
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  testTinySVDImp<double>();
  return;
}

Assistant:

void
testTinySVD ()
{
    std::cout << "Testing TinySVD algorithms in single precision..."
              << std::endl;
    testTinySVDImp<float> ();

    std::cout << "Testing TinySVD algorithms in double precision..."
              << std::endl;
    testTinySVDImp<double> ();
}